

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

VarConcat * __thiscall kratos::VarConcat::concat(VarConcat *this,Var *var)

{
  undefined1 auVar1 [8];
  undefined1 local_50 [16];
  shared_ptr<kratos::Var> local_40;
  undefined1 local_30 [8];
  shared_ptr<kratos::VarConcat> result;
  
  Var::as<kratos::VarConcat>((Var *)local_50);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var->super_enable_shared_from_this<kratos::Var>);
  local_30 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::VarConcat,std::allocator<kratos::VarConcat>,std::shared_ptr<kratos::VarConcat>,std::shared_ptr<kratos::Var>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result,(VarConcat **)local_30,
             (allocator<kratos::VarConcat> *)
             ((long)&result.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7),(shared_ptr<kratos::VarConcat> *)local_50,&local_40);
  std::__shared_ptr<kratos::VarConcat,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::VarConcat,kratos::VarConcat>
            ((__shared_ptr<kratos::VarConcat,(__gnu_cxx::_Lock_policy)2> *)local_30,
             (VarConcat *)local_30);
  if ((pointer)local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((pointer)local_50._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  std::vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
  ::emplace_back<std::shared_ptr<kratos::VarConcat>const&>
            ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
              *)&(*(this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                   _M_impl.super__Vector_impl_data._M_start)->concat_vars_,
             (shared_ptr<kratos::VarConcat> *)local_30);
  auVar1 = local_30;
  if (result.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               result.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return (VarConcat *)auVar1;
}

Assistant:

VarConcat &VarConcat::concat(kratos::Var &var) {
    auto result = std::make_shared<VarConcat>(as<VarConcat>(), var.shared_from_this());
    // add it to the first one
    vars_[0]->add_concat_var(result);
    return *result;
}